

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  string *field2;
  string *field1;
  __type _Var1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference ppFVar6;
  string *psVar7;
  reference pvVar8;
  _Bit_reference *p_Var9;
  reference this_00;
  LogMessage *pLVar10;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo>_>
  this_01;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  string_view sVar11;
  reference rVar12;
  AlphaNum local_420;
  AlphaNum local_3f0;
  reference local_3c0;
  string local_3b0;
  string local_390;
  undefined1 local_370 [8];
  FieldGeneratorInfo info;
  FieldDescriptor *field_1;
  int i_1;
  LogMessage local_298;
  Voidify local_281;
  reference local_280;
  reference local_270;
  reference local_260;
  string_view local_250;
  string_view local_240;
  AlphaNum local_230;
  string_view local_200;
  AlphaNum local_1f0;
  AlphaNum local_1c0;
  string_view local_190;
  AlphaNum local_180;
  AlphaNum local_150;
  string local_120;
  reference local_100;
  reference local_f0;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string *other_name;
  FieldDescriptor *other;
  undefined1 local_a8 [4];
  int j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *name;
  FieldDescriptor *field;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  allocator<bool> local_41;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> is_conflict;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Context *this_local;
  
  is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)fields;
  sVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(fields);
  std::allocator<bool>::allocator(&local_41);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_40,sVar4,&local_41);
  std::allocator<bool>::~allocator(&local_41);
  sVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&field + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i,sVar4,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&field + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&field + 7));
  field._0_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(int)field;
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    if (sVar4 <= uVar5) break;
    ppFVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage,(long)(int)field);
    name = (string *)*ppFVar6;
    CapitalizedFieldName_abi_cxx11_((string *)local_a8,(java *)name,field_00);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    other._4_4_ = (int)field;
    while( true ) {
      other._4_4_ = other._4_4_ + 1;
      uVar5 = (ulong)other._4_4_;
      sVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
      if (sVar4 <= uVar5) break;
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage,(long)other._4_4_);
      other_name = (string *)*ppFVar6;
      CapitalizedFieldName_abi_cxx11_(&local_e0,(java *)other_name,field_01);
      local_c0 = &local_e0;
      _Var1 = std::operator==(local_88,local_c0);
      field1 = name;
      if (_Var1) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_40,(long)other._4_4_);
        local_f0 = rVar12;
        p_Var9 = std::_Bit_reference::operator=(&local_f0,true);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field);
        local_100 = rVar12;
        std::_Bit_reference::operator=(&local_100,p_Var9);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_150,"capitalized name of field \"");
        sVar11 = FieldDescriptor::name((FieldDescriptor *)name);
        local_190 = sVar11;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_180,sVar11);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1c0,"\" conflicts with field \"");
        sVar11 = FieldDescriptor::name((FieldDescriptor *)other_name);
        local_200 = sVar11;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1f0,sVar11);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_230,"\"");
        absl::lts_20250127::StrCat<>
                  (&local_120,&local_150,&local_180,&local_1c0,&local_1f0,&local_230);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(long)other._4_4_);
        psVar7 = (string *)std::__cxx11::string::operator=((string *)pvVar8,(string *)&local_120);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(long)(int)field);
        std::__cxx11::string::operator=((string *)pvVar8,psVar7);
        std::__cxx11::string::~string((string *)&local_120);
      }
      else {
        sVar11 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
        field2 = other_name;
        local_240 = sVar11;
        sVar11 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
        local_250 = sVar11;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&i,(long)other._4_4_);
        bVar2 = anon_unknown_6::IsConflicting
                          ((FieldDescriptor *)field1,local_240,(FieldDescriptor *)field2,local_250,
                           pvVar8);
        if (bVar2) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_40,(long)other._4_4_);
          local_260 = rVar12;
          p_Var9 = std::_Bit_reference::operator=(&local_260,true);
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field);
          local_270 = rVar12;
          std::_Bit_reference::operator=(&local_270,p_Var9);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&i,(long)other._4_4_);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&i,(long)(int)field);
          std::__cxx11::string::operator=((string *)this_00,(string *)pvVar8);
        }
      }
      std::__cxx11::string::~string((string *)&local_e0);
    }
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_40,(long)(int)field);
    local_280 = rVar12;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_280);
    if (bVar2) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_298,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/context.cc"
                 ,0xa3);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_298);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar10,(char (*) [8])0xbf985c);
      sVar11 = FieldDescriptor::full_name((FieldDescriptor *)name);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar10,sVar11);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar10,(char (*) [18])"\" is conflicting ");
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar10,(char (*) [21])"with another field: ");
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)(int)field);
      pLVar10 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar10,pvVar8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_281,pLVar10);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_298);
    }
    std::__cxx11::string::~string((string *)local_a8);
    field._0_4_ = (int)field + 1;
  }
  field_1._4_4_ = 0;
  while( true ) {
    sVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    if (sVar4 <= (ulong)(long)field_1._4_4_) break;
    ppFVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage,(long)field_1._4_4_);
    info.options._72_8_ = *ppFVar6;
    FieldGeneratorInfo::FieldGeneratorInfo((FieldGeneratorInfo *)local_370);
    CamelCaseFieldName_abi_cxx11_(&local_390,(java *)info.options._72_8_,field_02);
    std::__cxx11::string::operator=((string *)local_370,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    CapitalizedFieldName_abi_cxx11_(&local_3b0,(java *)info.options._72_8_,field_03);
    std::__cxx11::string::operator=
              ((string *)(info.name.field_2._M_local_buf + 8),(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_40,(long)field_1._4_4_);
    local_3c0 = rVar12;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_3c0);
    if (bVar2) {
      iVar3 = FieldDescriptor::number((FieldDescriptor *)info.options._72_8_);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_3f0,iVar3);
      absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_370,&local_3f0);
      iVar3 = FieldDescriptor::number((FieldDescriptor *)info.options._72_8_);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_420,iVar3);
      absl::lts_20250127::StrAppend
                ((Nonnull<std::string_*>)((long)&info.name.field_2 + 8),&local_420);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i,(long)field_1._4_4_);
      std::__cxx11::string::operator=
                ((string *)(info.capitalized_name.field_2._M_local_buf + 8),(string *)pvVar8);
    }
    java::Options::operator=
              ((Options *)((long)&info.disambiguated_reason.field_2 + 8),&this->options_);
    this_01 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
              ::
              operator[]<google::protobuf::FieldDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
                          *)&this->field_generator_info_map_,
                         (key_arg<const_google::protobuf::FieldDescriptor_*> *)
                         &info.options.strip_nonfunctional_codegen);
    FieldGeneratorInfo::operator=(this_01,(FieldGeneratorInfo *)local_370);
    FieldGeneratorInfo::~FieldGeneratorInfo((FieldGeneratorInfo *)local_370);
    field_1._4_4_ = field_1._4_4_ + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_40)
  ;
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = CapitalizedFieldName(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = CapitalizedFieldName(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            absl::StrCat("capitalized name of field \"", field->name(),
                         "\" conflicts with field \"", other->name(), "\"");
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      ABSL_LOG(WARNING) << "field \"" << field->full_name()
                        << "\" is conflicting "
                        << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = CapitalizedFieldName(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      absl::StrAppend(&info.name, field->number());
      absl::StrAppend(&info.capitalized_name, field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    info.options = options_;
    field_generator_info_map_[field] = info;
  }
}